

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O0

set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
* __thiscall
Kandinsky::BaseExpression::variables
          (BaseExpression *this,shared_ptr<Kandinsky::BaseExpression> *thisSharedPtr)

{
  undefined8 in_RDX;
  long *in_RSI;
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  *in_RDI;
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  *variableSet;
  
  std::
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::set((set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
         *)0x117aa3);
  (**(code **)(*in_RSI + 0x20))(in_RSI,in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

std::set<Variable, VariableLessThanComparator> BaseExpression::variables(const std::shared_ptr<BaseExpression>& thisSharedPtr) const
    {
        std::set<Variable, VariableLessThanComparator> variableSet;
        fillVariableSet(variableSet, thisSharedPtr);
        return variableSet;
    }